

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

double av1_tpl_compute_frame_mv_entropy(TplDepFrame *tpl_frame,uint8_t right_shift)

{
  int iVar1;
  int tpl_stride;
  int iVar2;
  int_mv iVar3;
  uint uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  int row;
  int step;
  int col;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  int count_col [500];
  int count_row [500];
  double local_fe8;
  double local_fe0;
  int local_fd8 [500];
  int local_808 [502];
  
  if (tpl_frame->is_valid != '\0') {
    memset(local_808,0,2000);
    memset(local_fd8,0,2000);
    step = 1 << (right_shift & 0x1f);
    iVar1 = tpl_frame->mi_rows;
    local_fe0 = 0.0;
    local_fe8 = 0.0;
    if (0 < iVar1) {
      tpl_stride = tpl_frame->stride;
      iVar2 = tpl_frame->mi_cols;
      iVar7 = 0;
      row = 0;
      do {
        if (0 < iVar2) {
          col = 0;
          do {
            iVar3 = av1_compute_mv_difference(tpl_frame,row,col,step,tpl_stride,(uint)right_shift);
            uVar4 = (uint)iVar3.as_mv.row;
            if (0x1f2 < (int)uVar4) {
              uVar4 = 499;
            }
            uVar5 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              uVar5 = 0;
            }
            local_808[uVar5] = local_808[uVar5] + 1;
            local_fd8[uVar5] = local_fd8[uVar5] + 1;
            iVar7 = iVar7 + 1;
            col = col + step;
          } while (col < iVar2);
        }
        row = row + step;
      } while (row < iVar1);
      local_fe8 = (double)iVar7;
    }
    lVar6 = 0;
    dVar8 = 0.0;
    do {
      if (local_808[lVar6] != 0) {
        dVar10 = (double)local_808[lVar6];
        dVar9 = log2(dVar10 / local_fe8);
        dVar8 = dVar8 - dVar9 * dVar10;
      }
      if (local_fd8[lVar6] != 0) {
        dVar10 = (double)local_fd8[lVar6];
        dVar9 = log2(dVar10 / local_fe8);
        local_fe0 = local_fe0 - dVar9 * dVar10;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 500);
    return dVar8 + local_fe0;
  }
  return 0.0;
}

Assistant:

double av1_tpl_compute_frame_mv_entropy(const TplDepFrame *tpl_frame,
                                        uint8_t right_shift) {
  if (!tpl_frame->is_valid) {
    return 0;
  }

  int count_row[500] = { 0 };
  int count_col[500] = { 0 };
  int n = 0;  // number of MVs to process

  const int tpl_stride = tpl_frame->stride;
  const int step = 1 << right_shift;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      int_mv mv = av1_compute_mv_difference(tpl_frame, row, col, step,
                                            tpl_stride, right_shift);
      count_row[clamp(mv.as_mv.row, 0, 499)] += 1;
      count_col[clamp(mv.as_mv.row, 0, 499)] += 1;
      n += 1;
    }
  }

  // Estimate the bits used using the entropy formula.
  double rate_row = 0;
  double rate_col = 0;
  for (int i = 0; i < 500; i++) {
    if (count_row[i] != 0) {
      double p = count_row[i] / (double)n;
      rate_row += count_row[i] * -log2(p);
    }
    if (count_col[i] != 0) {
      double p = count_col[i] / (double)n;
      rate_col += count_col[i] * -log2(p);
    }
  }

  return rate_row + rate_col;
}